

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::AltNode::AnnotatePass1
          (AltNode *this,Compiler *compiler,bool parentNotInLoop,bool parentAtLeastOnce,
          bool parentNotSpeculative,bool parentNotNegated)

{
  uint16 *puVar1;
  undefined1 *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  CharSet<char16_t> *this_00;
  Node *pNVar6;
  int iVar7;
  undefined7 in_register_00000009;
  uint uVar8;
  undefined7 in_register_00000011;
  uint uVar9;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  ulong uVar10;
  CountDomain CVar11;
  AltNode *curr;
  AltNode *pAVar12;
  bool bVar13;
  
  uVar9 = (uint)CONCAT71(in_register_00000081,parentNotSpeculative);
  uVar8 = (uint)CONCAT71(in_register_00000011,parentNotInLoop);
  iVar7 = 0;
  ThreadContext::ProbeStackNoDispose
            (compiler->scriptContext->threadContext,0x6000,compiler->scriptContext,(PVOID)0x0);
  (this->super_Node).features = 0x80;
  *(uint *)&(this->super_Node).field_0xc =
       (int)CONCAT71(in_register_00000089,parentNotNegated) << 0xd |
       uVar9 << 0xc | (int)CONCAT71(in_register_00000009,parentAtLeastOnce) << 0xb | uVar8 << 10 |
       *(uint *)&(this->super_Node).field_0xc & 0xffffc3ff;
  this_00 = (CharSet<char16_t> *)new<Memory::ArenaAllocator>(0x28,compiler->ctAllocator,0x364470);
  CharSet<char16_t>::CharSet(this_00);
  (this->super_Node).firstSet = this_00;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xffffffcc | 0x31;
  uVar10 = 0xffffffff;
  CVar11.lower = 0;
  CVar11.upper = 0;
  pAVar12 = this;
  do {
    (*pAVar12->head->_vptr_Node[7])
              (pAVar12->head,compiler,(ulong)(uVar8 & 0xff),0,(ulong)(uVar9 & 0xff),
               (ulong)(*(uint *)&(this->super_Node).field_0xc >> 0xd & 1));
    pNVar6 = pAVar12->head;
    puVar1 = &(this->super_Node).features;
    *puVar1 = *puVar1 | pNVar6->features;
    uVar5 = *(uint *)&pNVar6->field_0xc;
    if ((uVar5 & 0x10) == 0) {
      puVar2 = &(this->super_Node).field_0xc;
      *puVar2 = *puVar2 & 0xef;
      uVar5 = *(uint *)&pAVar12->head->field_0xc;
    }
    if ((uVar5 & 0x20) == 0) {
      puVar2 = &(this->super_Node).field_0xc;
      *puVar2 = *puVar2 & 0xdf;
    }
    pNVar6 = pAVar12->head;
    bVar13 = iVar7 == 0;
    iVar7 = iVar7 + -1;
    if (bVar13) {
      CVar11 = pNVar6->thisConsumes;
      (this->super_Node).thisConsumes = CVar11;
      pNVar6 = pAVar12->head;
    }
    else {
      uVar5 = (pNVar6->thisConsumes).lower;
      uVar3 = (this->super_Node).thisConsumes.lower;
      if (uVar3 < uVar5) {
        uVar5 = uVar3;
      }
      uVar3 = (this->super_Node).thisConsumes.upper;
      (this->super_Node).thisConsumes.lower = uVar5;
      uVar5 = 0xffffffff;
      if (((uVar3 != 0xffffffff) && (uVar4 = (pNVar6->thisConsumes).upper, uVar4 != 0xffffffff)) &&
         (uVar5 = uVar4, uVar4 < uVar3)) {
        uVar5 = uVar3;
      }
      (this->super_Node).thisConsumes.upper = uVar5;
      uVar5 = (pNVar6->thisConsumes).upper;
      if ((uVar5 == 0xffffffff) || (CVar11.lower <= uVar5)) {
        puVar2 = &(this->super_Node).field_0xc;
        *puVar2 = *puVar2 & 0xef;
        pNVar6 = pAVar12->head;
      }
      if (((uint)uVar10 == 0xffffffff) || ((pNVar6->thisConsumes).lower <= (uint)uVar10)) {
        puVar2 = &(this->super_Node).field_0xc;
        *puVar2 = *puVar2 & 0xdf;
        pNVar6 = pAVar12->head;
      }
      CVar11 = pNVar6->thisConsumes;
    }
    CharSet<char16_t>::UnionInPlace
              ((this->super_Node).firstSet,compiler->ctAllocator,pNVar6->firstSet);
    uVar5 = *(uint *)&pAVar12->head->field_0xc;
    if ((((uVar5 & 2) == 0 & (byte)uVar5) == 0) &&
       (puVar2 = &(this->super_Node).field_0xc, *puVar2 = *puVar2 & 0xfe,
       (pAVar12->head->field_0xc & 2) != 0)) {
      puVar2 = &(this->super_Node).field_0xc;
      *puVar2 = *puVar2 | 2;
    }
    uVar10 = (ulong)CVar11 >> 0x20;
    pAVar12 = pAVar12->tail;
  } while (pAVar12 != (AltNode *)0x0);
  return;
}

Assistant:

void AltNode::AnnotatePass1(Compiler& compiler, bool parentNotInLoop, bool parentAtLeastOnce, bool parentNotSpeculative, bool parentNotNegated)
    {
        PROBE_STACK_NO_DISPOSE(compiler.scriptContext, Js::Constants::MinStackRegex);

        features = HasAlt;
        isNotInLoop = parentNotInLoop;
        isAtLeastOnce = parentAtLeastOnce;
        isNotSpeculative = parentNotSpeculative;
        isNotNegated = parentNotNegated;

        // Overall alternative:
        //  - is irrefutable if at least one item is irrefutable
        //  - will not progress(regress) if each item will not progress(regress) and has strictly decreasing(increasing) consumes

        firstSet = Anew(compiler.ctAllocator, UnicodeCharSet);
        isThisIrrefutable = false;
        isThisWillNotProgress = true;
        isThisWillNotRegress = true;
        isFirstExact = true;
        CountDomain prevConsumes;
        int item = 0;
        for (AltNode *curr = this; curr != 0; curr = curr->tail, item++)
        {
            curr->head->AnnotatePass1(compiler, parentNotInLoop, false, parentNotSpeculative, isNotNegated);
            features |= curr->head->features;
            if (!curr->head->isThisWillNotProgress)
                isThisWillNotProgress = false;
            if (!curr->head->isThisWillNotRegress)
                isThisWillNotRegress = false;
            if (item == 0)
                prevConsumes = thisConsumes = curr->head->thisConsumes;
            else
            {
                thisConsumes.Lub(curr->head->thisConsumes);
                if (!curr->head->thisConsumes.IsLessThan(prevConsumes))
                    isThisWillNotProgress = false;
                if (!curr->head->thisConsumes.IsGreaterThan(prevConsumes))
                    isThisWillNotRegress = false;
                prevConsumes = curr->head->thisConsumes;
            }
            firstSet->UnionInPlace(compiler.ctAllocator, *curr->head->firstSet);
            if (!curr->head->isFirstExact || curr->head->isThisIrrefutable)
                // If any item is irrefutable then later items may never be taken, so first set cannot be exact
                isFirstExact = false;
            if (curr->head->isThisIrrefutable)
                isThisIrrefutable = true;
        }
    }